

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O1

Vector<String> * __thiscall
dxil_spv::Converter::get_entry_points_abi_cxx11_
          (Vector<String> *__return_storage_ptr__,Converter *this,LLVMBCParser *parser)

{
  uint uVar1;
  Module *this_00;
  NamedMDNode *this_01;
  MDNode *this_02;
  MDOperand *pMVar2;
  uint in_ECX;
  uint index;
  String local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_dxil_spv::ThreadLocalAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_dxil_spv::ThreadLocalAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_dxil_spv::ThreadLocalAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = LLVMBCParser::get_module((LLVMBCParser *)this);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>::
  _M_construct<char_const*>
            ((basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>> *)
             &local_50,"dx.entryPoints","");
  this_01 = LLVMBC::Module::getNamedMetadata(this_00,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    free_in_thread(local_50._M_dataplus._M_p);
  }
  uVar1 = LLVMBC::NamedMDNode::getNumOperands(this_01);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_dxil_spv::ThreadLocalAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>
  ::reserve(__return_storage_ptr__,(ulong)uVar1);
  if (uVar1 != 0) {
    index = 0;
    do {
      this_02 = LLVMBC::NamedMDNode::getOperand(this_01,index);
      if (this_02 != (MDNode *)0x0) {
        pMVar2 = LLVMBC::MDNode::getOperand(this_02,0);
        if (pMVar2->kind != None) {
          get_string_metadata_abi_cxx11_(&local_50,(dxil_spv *)this_02,(MDNode *)0x1,in_ECX);
          std::
          vector<std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>,dxil_spv::ThreadLocalAllocator<std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>>>
          ::
          emplace_back<std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>>
                    ((vector<std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>,dxil_spv::ThreadLocalAllocator<std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>>>
                      *)__return_storage_ptr__,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            free_in_thread(local_50._M_dataplus._M_p);
          }
        }
      }
      index = index + 1;
    } while (uVar1 != index);
  }
  return __return_storage_ptr__;
}

Assistant:

Vector<String> Converter::get_entry_points(const LLVMBCParser &parser)
{
	Vector<String> result;
	auto &module = parser.get_module();
	auto *ep_meta = module.getNamedMetadata("dx.entryPoints");

	unsigned num_entry_points = ep_meta->getNumOperands();
	result.reserve(num_entry_points);

	for (unsigned i = 0; i < num_entry_points; i++)
	{
		auto *node = ep_meta->getOperand(i);
		if (node)
		{
			auto &func_node = node->getOperand(0);
			if (func_node)
				result.push_back(get_string_metadata(node, 1));
		}
	}

	return result;
}